

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.h
# Opt level: O0

void JsrtDebuggerObjectBase::
     CreateDebuggerObject<JsrtDebuggerObjectGlobalsNode,JsrtDebuggerStackFrame::GetLocalsObject(Js::ScriptContext*)::__5>
               (JsrtDebuggerObjectsManager *debuggerObjectsManager,ResolvedObject resolvedObject,
               ScriptContext *scriptContext,bool forceSetValueProp,
               anon_class_8_1_8aaebaaf postFunction)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  WeakArenaReference<Js::IDiagObjectModelDisplay> *pWVar4;
  IDiagObjectModelDisplay *pIVar5;
  JsrtDebuggerObjectBase *pJVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  Var marshaledObj_00;
  Var marshaledObj;
  DynamicObject *object;
  JsrtDebuggerObjectBase *debuggerObject;
  IDiagObjectModelDisplay *objectDisplay;
  AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
  objectDisplayWeakRef;
  bool forceSetValueProp_local;
  ScriptContext *scriptContext_local;
  JsrtDebuggerObjectsManager *debuggerObjectsManager_local;
  anon_class_8_1_8aaebaaf postFunction_local;
  
  objectDisplayWeakRef.super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr.
  _7_1_ = forceSetValueProp;
  debuggerObjectsManager_local = (JsrtDebuggerObjectsManager *)postFunction.globalsObject;
  pWVar4 = Js::ResolvedObject::GetObjectDisplay(&resolvedObject);
  AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>::AutoPtr
            ((AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
              *)&objectDisplay,pWVar4);
  pWVar4 = BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::operator->
                     ((BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_> *)
                      &objectDisplay);
  pIVar5 = Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::GetStrongReference(pWVar4);
  if (pIVar5 != (IDiagObjectModelDisplay *)0x0) {
    pWVar4 = BasePtr::operator_cast_to_WeakArenaReference_((BasePtr *)&objectDisplay);
    pJVar6 = JsrtDebuggerObjectGlobalsNode::Make(debuggerObjectsManager,pWVar4);
    iVar3 = (*pJVar6->_vptr_JsrtDebuggerObjectBase[2])
                      (pJVar6,resolvedObject.scriptContext,
                       (ulong)(objectDisplayWeakRef.
                               super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>
                               .ptr._7_1_ & 1));
    if ((Var)CONCAT44(extraout_var,iVar3) == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.h"
                         ,0x2a,"(object != nullptr)","object != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    marshaledObj_00 =
         Js::CrossSite::MarshalVar(scriptContext,(Var)CONCAT44(extraout_var,iVar3),false);
    JsrtDebuggerStackFrame::GetLocalsObject::anon_class_8_1_8aaebaaf::operator()
              ((anon_class_8_1_8aaebaaf *)&debuggerObjectsManager_local,marshaledObj_00);
    BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::Detach
              ((BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_> *)&objectDisplay);
  }
  AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>::~AutoPtr
            ((AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
              *)&objectDisplay);
  return;
}

Assistant:

static void CreateDebuggerObject(JsrtDebuggerObjectsManager* debuggerObjectsManager, Js::ResolvedObject resolvedObject, Js::ScriptContext* scriptContext, bool forceSetValueProp, PostFunction postFunction)
    {
        AutoPtr<WeakArenaReference<Js::IDiagObjectModelDisplay>> objectDisplayWeakRef(resolvedObject.GetObjectDisplay());
        Js::IDiagObjectModelDisplay* objectDisplay = objectDisplayWeakRef->GetStrongReference();
        if (objectDisplay != nullptr)
        {
            JsrtDebuggerObjectBase* debuggerObject = JsrtDebuggerObjectType::Make(debuggerObjectsManager, objectDisplayWeakRef);
            Js::DynamicObject* object = debuggerObject->GetJSONObject(resolvedObject.scriptContext, forceSetValueProp);
            Assert(object != nullptr);
            Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, object);
            postFunction(marshaledObj);
            objectDisplayWeakRef.Detach();
        }
    }